

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

double PID_angle_control(double psi_bar,double psi_bar_prev,double psi,double omega,double *pipsi,
                        double direction_coef,double dt,double Kp,double Kd,double Ki,double up_max,
                        double ud_max,double ui_max,double u_min,double u_max,double error_min,
                        double error_max,double omega_max)

{
  uchar *tbs;
  size_t *siglen;
  size_t *siglen_00;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *siglen_01;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *psVar1;
  size_t *siglen_02;
  uchar *in_RSI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_70;
  double integral;
  double derivative;
  double error;
  double u;
  double Kd_local;
  double Kp_local;
  double dt_local;
  double direction_coef_local;
  double *pipsi_local;
  double omega_local;
  double psi_local;
  double psi_bar_prev_local;
  double psi_bar_local;
  
  ctx = (EVP_PKEY_CTX *)pipsi;
  dVar2 = fmod_2PI(psi_bar - psi);
  tbs = (uchar *)0x8000000000000000;
  local_70 = *pipsi;
  if ((psi_bar != psi_bar_prev) || (NAN(psi_bar) || NAN(psi_bar_prev))) {
    local_70 = 0.0;
  }
  if (dVar2 <= error_max) {
    if (error_min <= dVar2) {
      if (ABS((Kp * dVar2) / 3.141592653589793) <= up_max) {
        sign(ctx,in_RSI,siglen,(uchar *)0x8000000000000000,in_R8);
        dVar3 = (extraout_XMM0_Qa_03 * Kp * dVar2) / 3.141592653589793;
        psVar1 = extraout_RDX_00;
      }
      else {
        sign(ctx,in_RSI,siglen,(uchar *)0x8000000000000000,in_R8);
        sign(ctx,in_RSI,siglen_00,tbs,in_R8);
        dVar3 = extraout_XMM0_Qa_01 * extraout_XMM0_Qa_02 * up_max;
        psVar1 = extraout_RDX;
      }
      error = dVar3 + 0.0;
      if (ABS((Kd * -omega) / omega_max) <= ud_max) {
        sign(ctx,in_RSI,psVar1,tbs,in_R8);
        dVar3 = (extraout_XMM0_Qa_06 * Kd * -omega) / omega_max;
        psVar1 = extraout_RDX_02;
      }
      else {
        sign(ctx,in_RSI,psVar1,tbs,in_R8);
        sign(ctx,in_RSI,siglen_01,tbs,in_R8);
        dVar3 = extraout_XMM0_Qa_04 * extraout_XMM0_Qa_05 * ud_max;
        psVar1 = extraout_RDX_01;
      }
      error = dVar3 + error;
      if (ABS((Ki * local_70) / 3.141592653589793) <= ui_max) {
        sign(ctx,in_RSI,psVar1,tbs,in_R8);
        dVar3 = (extraout_XMM0_Qa_09 * Ki * local_70) / 3.141592653589793;
      }
      else {
        sign(ctx,in_RSI,psVar1,tbs,in_R8);
        sign(ctx,in_RSI,siglen_02,tbs,in_R8);
        dVar3 = extraout_XMM0_Qa_07 * extraout_XMM0_Qa_08 * ui_max;
      }
      error = dVar3 + error;
      local_70 = dVar2 * dt + local_70;
    }
    else {
      sign(ctx,in_RSI,siglen,(uchar *)0x8000000000000000,in_R8);
      error = extraout_XMM0_Qa_00 * u_min;
      local_70 = 0.0;
    }
  }
  else {
    sign(ctx,in_RSI,siglen,(uchar *)0x8000000000000000,in_R8);
    error = extraout_XMM0_Qa * u_max;
    local_70 = 0.0;
  }
  if (u_min <= error) {
    if (error <= u_max) {
      local_98 = error;
    }
    else {
      local_98 = u_max;
    }
    local_90 = local_98;
  }
  else {
    local_90 = u_min;
  }
  *pipsi = local_70;
  return local_90;
}

Assistant:

inline double PID_angle_control(double psi_bar, double psi_bar_prev, double psi, double omega, double* pipsi, double direction_coef, double dt,
	double Kp, double Kd, double Ki, double up_max, double ud_max, double ui_max,
	double u_min, double u_max, double error_min, double error_max, double omega_max)
{
	double u = 0;
	double error = fmod_2PI(psi_bar-psi);
	double derivative = -omega;
	double integral = *pipsi;
	if (psi_bar != psi_bar_prev) integral = 0;
	if (error > error_max)
	{
		u = sign(direction_coef, 0)*u_max;
		integral = 0;
	}
	else if (error < error_min)
	{
		u = sign(direction_coef, 0)*u_min;
		integral = 0;
	}
	else
	{
		if (fabs(Kp*error/M_PI) > up_max) u += sign(direction_coef, 0)*sign(Kp*error/M_PI, 0)*up_max;
		else u += sign(direction_coef, 0)*Kp*error/M_PI; // /M_PI to try to normalize...
		if (fabs(Kd*derivative/omega_max) > ud_max) u += sign(direction_coef, 0)*sign(Kd*derivative/omega_max, 0)*ud_max;
		else u += sign(direction_coef, 0)*Kd*derivative/omega_max; // /omegaz_max to try to normalize...
		if (fabs(Ki*integral/M_PI) > ui_max) u += sign(direction_coef, 0)*sign(Ki*integral/M_PI, 0)*ui_max;
		else u += sign(direction_coef, 0)*Ki*integral/M_PI; // /M_PI to try to normalize...
		integral = integral+error*dt;
	}
	u = (u < u_min)? u_min: ((u > u_max)? u_max: u);
	*pipsi = integral;
	return u;
}